

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

optional<int> __thiscall Instructions::defineName(Instructions *this,string *name,int line)

{
  bool bVar1;
  size_type sVar2;
  size_t in_RCX;
  unsigned_long local_38;
  size_type result;
  uint local_24;
  string *psStack_20;
  int line_local;
  string *name_local;
  Instructions *this_local;
  
  local_24 = line;
  psStack_20 = name;
  name_local = (string *)this;
  register0x00000000 = (_Optional_payload_base<int>)findName(this,name);
  bVar1 = std::optional<int>::has_value((optional<int> *)((long)&result + 4));
  if (bVar1) {
    std::optional<int>::optional((optional<int> *)&this_local);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->names,psStack_20);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->names);
    local_38 = sVar2 - 1;
    write(this,8,(void *)(ulong)local_24,in_RCX);
    write(this,(uint)local_38 & 0xff,(void *)(ulong)local_24,in_RCX);
    std::optional<int>::optional<unsigned_long,_true>((optional<int> *)&this_local,&local_38);
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)this_local;
}

Assistant:

std::optional<int> Instructions::defineName(const std::string& name, int line)
{
    if (findName(name).has_value())
    {
        return {};
    }
    else
    {
        names.push_back(name);
        auto result = names.size() - 1;
        write(OpCode::DEFINE_NAME, line);
        write(result, line);
        return result;
    }
}